

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O2

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *pvVar1;
  ulong in_RDX;
  size_t __n;
  
  pvVar1 = *(void **)dst;
  if (*(ulong *)(dst + 0x10) < in_RDX) {
    memcpy(src,pvVar1,*(ulong *)(dst + 0x10) << 4);
    pvVar1 = *(void **)(dst + 8);
    src = src + *(long *)(dst + 0x10) * 0x10;
    __n = (in_RDX - *(long *)(dst + 0x10)) * 0x10;
  }
  else {
    __n = in_RDX << 4;
  }
  pvVar1 = memcpy(src,pvVar1,__n);
  return (int)pvVar1;
}

Assistant:

static inline void
copy(TempSpace& src, cacheblock_t* dst, size_t n)
{
	if (n > src.elements_in_strings) {
		(void) memcpy(dst, src.strings,
			src.elements_in_strings*sizeof(cacheblock_t));
		(void) memcpy(dst+src.elements_in_strings, src.allocated,
			(n-src.elements_in_strings)*sizeof(cacheblock_t));
	} else {
		(void) memcpy(dst, src.strings, n*sizeof(cacheblock_t));
	}
}